

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowCodeCacheStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  char cVar1;
  Vdbe *p_00;
  int p2;
  int iVar2;
  KeyInfo *pP4;
  bool bVar3;
  int local_ec;
  int local_e4;
  int local_c0;
  int local_b8;
  int local_a4;
  KeyInfo *pKeyInfo;
  int regPeer;
  int iOff;
  int addrJump;
  int bCurrent;
  int addr2;
  int bReverse;
  int lblEmpty;
  int regSize;
  int regArg;
  int regCtr;
  int csrLead;
  int lblFlushPart;
  int regFlushPart;
  int addrNext;
  int addrGoto;
  int regNewPeer;
  int nPeer;
  ExprList *pOrderBy;
  ExprList *pPart;
  int addr;
  int k;
  Vdbe *v;
  Window *pMWin;
  int addrGosub_local;
  int regGosub_local;
  WhereInfo *pWInfo_local;
  Select *p_local;
  Parse *pParse_local;
  
  v = (Vdbe *)p->pWin;
  pMWin._0_4_ = addrGosub;
  pMWin._4_4_ = regGosub;
  _addrGosub_local = pWInfo;
  pWInfo_local = (WhereInfo *)p;
  p_local = (Select *)pParse;
  _addr = sqlite3GetVdbe(pParse);
  pOrderBy = (ExprList *)v->pPrev;
  _regNewPeer = v->pNext;
  if (_regNewPeer == (Vdbe *)0x0) {
    local_a4 = 0;
  }
  else {
    local_a4 = *(int *)&_regNewPeer->db;
  }
  addrGoto = local_a4;
  bVar3 = false;
  if ((v->pNext != (Vdbe *)0x0) && (bVar3 = false, *(char *)((long)&v->pParse + 1) == 'R')) {
    bVar3 = *(char *)((long)&v->pParse + 2) == 'W';
  }
  p2 = sqlite3VdbeMakeLabel(_addr);
  addrNext = *(int *)&p_local->pGroupBy + 1;
  *(int *)&p_local->pGroupBy = addrGoto + *(int *)&p_local->pGroupBy;
  csrLead = *(int *)&p_local->pGroupBy + 1;
  *(int *)&p_local->pGroupBy = csrLead;
  regCtr = sqlite3VdbeMakeLabel(_addr);
  regArg = *(int *)((long)&p_local->pWhere + 4);
  *(int *)((long)&p_local->pWhere + 4) = regArg + 1;
  regSize = *(int *)&p_local->pGroupBy + 1;
  *(int *)&p_local->pGroupBy = regSize;
  windowPartitionCache
            ((Parse *)p_local,(Select *)pWInfo_local,_addrGosub_local,csrLead,regCtr,&bReverse);
  regFlushPart = sqlite3VdbeAddOp0(_addr,0xb);
  sqlite3VdbeResolveLabel(_addr,regCtr);
  p_00 = _addr;
  iVar2 = sqlite3VdbeCurrentAddr(_addr);
  sqlite3VdbeAddOp2(p_00,0x11,0,iVar2 + 2);
  sqlite3VdbeAddOp2(_addr,0x6f,regArg,(int)v->iCurrentTime);
  lblEmpty = windowInitAccum((Parse *)p_local,(Window *)v);
  sqlite3VdbeAddOp2(_addr,0x46,0,regSize);
  sqlite3VdbeAddOp2(_addr,0x24,regArg,p2);
  sqlite3VdbeAddOp2(_addr,0x24,(int)v->iCurrentTime,p2);
  if (bVar3) {
    iVar2 = sqlite3VdbeCurrentAddr(_addr);
    windowAggStep((Parse *)p_local,(Window *)v,regArg,0,lblEmpty,bReverse);
    sqlite3VdbeAddOp2(_addr,5,regArg,iVar2);
    sqlite3VdbeAddOp2(_addr,0x24,regArg,p2);
  }
  lblFlushPart = sqlite3VdbeCurrentAddr(_addr);
  if ((_regNewPeer != (Vdbe *)0x0) &&
     ((*(char *)((long)&v->pParse + 2) == 'R' || (*(char *)((long)&v->pParse + 1) == 'R')))) {
    cVar1 = *(char *)((long)&v->pParse + 1);
    regPeer = 0;
    if (*(char *)&v->pParse == 'V') {
      iVar2 = *(int *)&v->aOp;
      if (pOrderBy == (ExprList *)0x0) {
        local_b8 = 0;
      }
      else {
        local_b8 = pOrderBy->nExpr;
      }
      if (pOrderBy == (ExprList *)0x0) {
        local_c0 = 0;
      }
      else {
        local_c0 = pOrderBy->nExpr;
      }
      local_c0 = *(int *)((long)&v->nStmtDefCons + 4) + local_c0;
      pP4 = sqlite3KeyInfoFromExprList((Parse *)p_local,(ExprList *)_regNewPeer,0,0);
      for (pPart._4_4_ = 0; pPart._4_4_ < addrGoto; pPart._4_4_ = pPart._4_4_ + 1) {
        sqlite3VdbeAddOp3(_addr,0x5a,regArg,iVar2 + local_b8 + pPart._4_4_,addrNext + pPart._4_4_);
      }
      pPart._0_4_ = sqlite3VdbeAddOp3(_addr,0x57,addrNext,local_c0,addrGoto);
      sqlite3VdbeAppendP4(_addr,pP4,-9);
      regPeer = sqlite3VdbeAddOp3(_addr,0x10,(int)pPart + 2,0,(int)pPart + 2);
      sqlite3VdbeAddOp3(_addr,0x4e,addrNext,local_c0,addrGoto + -1);
    }
    if (cVar1 == 'R') {
      local_ec = bReverse;
      local_e4 = lblEmpty;
    }
    else {
      local_e4 = 0;
      local_ec = 0;
    }
    windowReturnRows((Parse *)p_local,(Window *)v,regSize,pMWin._4_4_,(int)pMWin,local_e4,local_ec);
    if (regPeer != 0) {
      sqlite3VdbeJumpHere(_addr,regPeer);
    }
  }
  if (!bVar3) {
    windowAggStep((Parse *)p_local,(Window *)v,regArg,0,lblEmpty,bReverse);
  }
  sqlite3VdbeAddOp2(_addr,0x53,regSize,1);
  sqlite3VdbeAddOp2(_addr,5,regArg,lblFlushPart);
  windowReturnRows((Parse *)p_local,(Window *)v,regSize,pMWin._4_4_,(int)pMWin,0,0);
  sqlite3VdbeResolveLabel(_addr,p2);
  sqlite3VdbeAddOp1(_addr,0x8b,(int)v->iCurrentTime);
  sqlite3VdbeAddOp1(_addr,0x42,csrLead);
  sqlite3VdbeJumpHere(_addr,regFlushPart);
  return;
}

Assistant:

static void windowCodeCacheStep(
  Parse *pParse, 
  Select *p,
  WhereInfo *pWInfo,
  int regGosub, 
  int addrGosub
){
  Window *pMWin = p->pWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int k;
  int addr;
  ExprList *pPart = pMWin->pPartition;
  ExprList *pOrderBy = pMWin->pOrderBy;
  int nPeer = pOrderBy ? pOrderBy->nExpr : 0;
  int regNewPeer;

  int addrGoto;                   /* Address of Goto used to jump flush_par.. */
  int addrNext;                   /* Jump here for next iteration of loop */
  int regFlushPart;
  int lblFlushPart;
  int csrLead;
  int regCtr;
  int regArg;                     /* Register array to martial function args */
  int regSize;
  int lblEmpty;
  int bReverse = pMWin->pOrderBy && pMWin->eStart==TK_CURRENT 
          && pMWin->eEnd==TK_UNBOUNDED;

  assert( (pMWin->eStart==TK_UNBOUNDED && pMWin->eEnd==TK_CURRENT) 
       || (pMWin->eStart==TK_UNBOUNDED && pMWin->eEnd==TK_UNBOUNDED) 
       || (pMWin->eStart==TK_CURRENT && pMWin->eEnd==TK_CURRENT) 
       || (pMWin->eStart==TK_CURRENT && pMWin->eEnd==TK_UNBOUNDED) 
  );

  lblEmpty = sqlite3VdbeMakeLabel(v);
  regNewPeer = pParse->nMem+1;
  pParse->nMem += nPeer;

  /* Allocate register and label for the "flush_partition" sub-routine. */
  regFlushPart = ++pParse->nMem;
  lblFlushPart = sqlite3VdbeMakeLabel(v);

  csrLead = pParse->nTab++;
  regCtr = ++pParse->nMem;

  windowPartitionCache(pParse, p, pWInfo, regFlushPart, lblFlushPart, &regSize);
  addrGoto = sqlite3VdbeAddOp0(v, OP_Goto);

  /* Start of "flush_partition" */
  sqlite3VdbeResolveLabel(v, lblFlushPart);
  sqlite3VdbeAddOp2(v, OP_Once, 0, sqlite3VdbeCurrentAddr(v)+2);
  VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_OpenDup, csrLead, pMWin->iEphCsr);

  /* Initialize the accumulator register for each window function to NULL */
  regArg = windowInitAccum(pParse, pMWin);

  sqlite3VdbeAddOp2(v, OP_Integer, 0, regCtr);
  sqlite3VdbeAddOp2(v, OP_Rewind, csrLead, lblEmpty);
  VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_Rewind, pMWin->iEphCsr, lblEmpty);
  VdbeCoverageNeverTaken(v);

  if( bReverse ){
    int addr2 = sqlite3VdbeCurrentAddr(v);
    windowAggStep(pParse, pMWin, csrLead, 0, regArg, regSize);
    sqlite3VdbeAddOp2(v, OP_Next, csrLead, addr2);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Rewind, csrLead, lblEmpty);
    VdbeCoverageNeverTaken(v);
  }
  addrNext = sqlite3VdbeCurrentAddr(v);

  if( pOrderBy && (pMWin->eEnd==TK_CURRENT || pMWin->eStart==TK_CURRENT) ){
    int bCurrent = (pMWin->eStart==TK_CURRENT);
    int addrJump = 0;             /* Address of OP_Jump below */
    if( pMWin->eType==TK_RANGE ){
      int iOff = pMWin->nBufferCol + (pPart ? pPart->nExpr : 0);
      int regPeer = pMWin->regPart + (pPart ? pPart->nExpr : 0);
      KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pOrderBy, 0, 0);
      for(k=0; k<nPeer; k++){
        sqlite3VdbeAddOp3(v, OP_Column, csrLead, iOff+k, regNewPeer+k);
      }
      addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPeer, regPeer, nPeer);
      sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
      addrJump = sqlite3VdbeAddOp3(v, OP_Jump, addr+2, 0, addr+2);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Copy, regNewPeer, regPeer, nPeer-1);
    }

    windowReturnRows(pParse, pMWin, regCtr, regGosub, addrGosub, 
        (bCurrent ? regArg : 0), (bCurrent ? regSize : 0)
    );
    if( addrJump ) sqlite3VdbeJumpHere(v, addrJump);
  }

  if( bReverse==0 ){
    windowAggStep(pParse, pMWin, csrLead, 0, regArg, regSize);
  }
  sqlite3VdbeAddOp2(v, OP_AddImm, regCtr, 1);
  sqlite3VdbeAddOp2(v, OP_Next, csrLead, addrNext);
  VdbeCoverage(v);

  windowReturnRows(pParse, pMWin, regCtr, regGosub, addrGosub, 0, 0);

  sqlite3VdbeResolveLabel(v, lblEmpty);
  sqlite3VdbeAddOp1(v, OP_ResetSorter, pMWin->iEphCsr);
  sqlite3VdbeAddOp1(v, OP_Return, regFlushPart);

  /* Jump to here to skip over flush_partition */
  sqlite3VdbeJumpHere(v, addrGoto);
}